

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::IteratorStep
               (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
               RecyclableObject **result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableObject *pRVar4;
  RecyclableObject **result_local;
  RecyclableObject *nextFunc_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  if (result == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2be1,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = IteratorNext(iterator,scriptContext,nextFunc,(Var)0x0);
  *result = pRVar4;
  bVar2 = IteratorComplete(*result,scriptContext);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool JavascriptOperators::IteratorStep(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, RecyclableObject** result)
    {
        Assert(result);

        *result = JavascriptOperators::IteratorNext(iterator, scriptContext, nextFunc);
        return !JavascriptOperators::IteratorComplete(*result, scriptContext);
    }